

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofSpringConstraint::internalUpdateSprings
          (btGeneric6DofSpringConstraint *this,btConstraintInfo2 *info)

{
  long lVar1;
  btScalar *pbVar2;
  float fVar3;
  float fVar4;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    if (*(char *)((long)this->m_equilibriumPoint + lVar1 + -7) == '\x01') {
      fVar3 = ((this->super_btGeneric6DofConstraint).m_calculatedLinearDiff.m_floats[lVar1] -
              this->m_equilibriumPoint[lVar1]) * this->m_springStiffness[lVar1];
      (this->super_btGeneric6DofConstraint).m_linearLimits.m_targetVelocity.m_floats[lVar1] =
           ((info->fps * this->m_springDamping[lVar1]) / (float)info->m_numIterations) * fVar3;
      (this->super_btGeneric6DofConstraint).m_linearLimits.m_maxMotorForce.m_floats[lVar1] =
           ABS(fVar3) / info->fps;
    }
  }
  pbVar2 = &(this->super_btGeneric6DofConstraint).m_angularLimits[0].m_maxMotorForce;
  for (lVar1 = -3; lVar1 != 0; lVar1 = lVar1 + 1) {
    if (*(char *)((long)this->m_equilibriumPoint + lVar1 + -1) == '\x01') {
      fVar4 = -((this->super_btGeneric6DofConstraint).m_calculatedAxisAngleDiff.m_floats[lVar1 + 3]
               - this->m_springStiffness[lVar1]) * this->m_springDamping[lVar1];
      fVar3 = info->fps;
      pbVar2[-1] = ((this->m_springDamping[lVar1 + 6] * fVar3) / (float)info->m_numIterations) *
                   fVar4;
      *pbVar2 = ABS(fVar4) / fVar3;
    }
    pbVar2 = pbVar2 + 0x10;
  }
  return;
}

Assistant:

void btGeneric6DofSpringConstraint::internalUpdateSprings(btConstraintInfo2* info)
{
	// it is assumed that calculateTransforms() have been called before this call
	int i;
	//btVector3 relVel = m_rbB.getLinearVelocity() - m_rbA.getLinearVelocity();
	for(i = 0; i < 3; i++)
	{
		if(m_springEnabled[i])
		{
			// get current position of constraint
			btScalar currPos = m_calculatedLinearDiff[i];
			// calculate difference
			btScalar delta = currPos - m_equilibriumPoint[i];
			// spring force is (delta * m_stiffness) according to Hooke's Law
			btScalar force = delta * m_springStiffness[i];
			btScalar velFactor = info->fps * m_springDamping[i] / btScalar(info->m_numIterations);
			m_linearLimits.m_targetVelocity[i] =  velFactor * force;
			m_linearLimits.m_maxMotorForce[i] =  btFabs(force) / info->fps;
		}
	}
	for(i = 0; i < 3; i++)
	{
		if(m_springEnabled[i + 3])
		{
			// get current position of constraint
			btScalar currPos = m_calculatedAxisAngleDiff[i];
			// calculate difference
			btScalar delta = currPos - m_equilibriumPoint[i+3];
			// spring force is (-delta * m_stiffness) according to Hooke's Law
			btScalar force = -delta * m_springStiffness[i+3];
			btScalar velFactor = info->fps * m_springDamping[i+3] / btScalar(info->m_numIterations);
			m_angularLimits[i].m_targetVelocity = velFactor * force;
			m_angularLimits[i].m_maxMotorForce = btFabs(force) / info->fps;
		}
	}
}